

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int add(char **argv)

{
  zip_t *pzVar1;
  FILE *pFVar2;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  zip_source_t *zs;
  char **argv_local;
  
  pzVar1 = za;
  pcVar6 = argv[1];
  sVar3 = strlen(argv[1]);
  lVar4 = zip_source_buffer(pzVar1,pcVar6,sVar3,0);
  pFVar2 = _stderr;
  pzVar1 = za;
  if (lVar4 == 0) {
    uVar5 = zip_strerror(za);
    fprintf(pFVar2,"can\'t create zip_source from buffer: %s\n",uVar5);
    argv_local._4_4_ = -1;
  }
  else {
    pcVar6 = decode_filename(*argv);
    lVar7 = zip_file_add(pzVar1,pcVar6,lVar4,0);
    if (lVar7 == -1) {
      zip_source_free(lVar4);
      pFVar2 = _stderr;
      pcVar6 = *argv;
      uVar5 = zip_strerror(za);
      fprintf(pFVar2,"can\'t add file \'%s\': %s\n",pcVar6,uVar5);
      argv_local._4_4_ = -1;
    }
    else {
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

static int
add(char *argv[]) {
    zip_source_t *zs;

    if ((zs = zip_source_buffer(za, argv[1], strlen(argv[1]), 0)) == NULL) {
        fprintf(stderr, "can't create zip_source from buffer: %s\n", zip_strerror(za));
        return -1;
    }

    if (zip_file_add(za, decode_filename(argv[0]), zs, 0) == -1) {
        zip_source_free(zs);
        fprintf(stderr, "can't add file '%s': %s\n", argv[0], zip_strerror(za));
        return -1;
    }
    return 0;
}